

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::checkRemoveMemObj(CLIntercept *this,cl_mem memobj)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_int>_>,_std::_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_int>_>_>
  pVar3;
  pair<std::_Rb_tree_iterator<std::pair<_cl_mem_*const,_unsigned_long>_>,_std::_Rb_tree_iterator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
  pVar4;
  pair<std::_Rb_tree_iterator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>,_std::_Rb_tree_iterator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
  pVar5;
  cl_uint refCount;
  cl_mem local_28;
  undefined8 local_20;
  
  __mutex = &this->m_Mutex;
  local_28 = memobj;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    local_20 = (cl_mem)((ulong)local_20._4_4_ << 0x20);
    (*(this->m_Dispatch).clGetMemObjectInfo)(local_28,0x1105,4,&local_20,(size_t *)0x0);
    if ((int)local_20 == 1) {
      local_20 = local_28;
      pVar3 = std::
              _Rb_tree<const_void_*,_std::pair<const_void_*const,_unsigned_int>,_std::_Select1st<std::pair<const_void_*const,_unsigned_int>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
              ::equal_range(&(this->m_MemAllocNumberMap)._M_t,(key_type *)&local_20);
      std::
      _Rb_tree<const_void_*,_std::pair<const_void_*const,_unsigned_int>,_std::_Select1st<std::pair<const_void_*const,_unsigned_int>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
      ::_M_erase_aux(&(this->m_MemAllocNumberMap)._M_t,(_Base_ptr)pVar3.first._M_node,
                     (_Base_ptr)pVar3.second._M_node);
      pVar4 = std::
              _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_unsigned_long>,_std::_Select1st<std::pair<_cl_mem_*const,_unsigned_long>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
              ::equal_range(&(this->m_BufferInfoMap)._M_t,&local_28);
      std::
      _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_unsigned_long>,_std::_Select1st<std::pair<_cl_mem_*const,_unsigned_long>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
      ::_M_erase_aux(&(this->m_BufferInfoMap)._M_t,(_Base_ptr)pVar4.first._M_node,
                     (_Base_ptr)pVar4.second._M_node);
      pVar5 = std::
              _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>,_std::_Select1st<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
              ::equal_range(&(this->m_ImageInfoMap)._M_t,&local_28);
      std::
      _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>,_std::_Select1st<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
      ::_M_erase_aux(&(this->m_ImageInfoMap)._M_t,(_Base_ptr)pVar5.first._M_node,
                     (_Base_ptr)pVar5.second._M_node);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void CLIntercept::checkRemoveMemObj(
    cl_mem memobj )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_uint refCount = getRefCount( memobj );
    if( refCount == 1 )
    {
        m_MemAllocNumberMap.erase( memobj );
        m_BufferInfoMap.erase( memobj );
        m_ImageInfoMap.erase( memobj );
    }
}